

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

Status __thiscall CFG::check(CFG *this)

{
  CfgNode *this_00;
  bool bVar1;
  Type TVar2;
  pointer ppVar3;
  CfgNode *node;
  iterator ed;
  iterator it;
  CFG *this_local;
  
  this->m_status = INVALID;
  if ((((((this->m_exitNode != (CfgNode *)0x0) || (this->m_haltNode != (CfgNode *)0x0)) &&
        (bVar1 = CfgNode::hasPredecessor(this->m_entryNode), !bVar1)) &&
       (bVar1 = CfgNode::hasSuccessors(this->m_entryNode), bVar1)) &&
      ((this->m_exitNode == (CfgNode *)0x0 ||
       ((bVar1 = CfgNode::hasSuccessors(this->m_exitNode), !bVar1 &&
        (bVar1 = CfgNode::hasPredecessor(this->m_exitNode), bVar1)))))) &&
     ((this->m_haltNode == (CfgNode *)0x0 ||
      ((bVar1 = CfgNode::hasSuccessors(this->m_haltNode), !bVar1 &&
       (bVar1 = CfgNode::hasPredecessor(this->m_haltNode), bVar1)))))) {
    ed = std::
         map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
         ::begin(&this->m_nodesMap);
    node = (CfgNode *)
           std::
           map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
           ::end(&this->m_nodesMap);
    while (bVar1 = std::operator!=(&ed,(_Self *)&node), bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgNode_*>_>::operator->(&ed);
      this_00 = ppVar3->second;
      if (this_00 == (CfgNode *)0x0) {
        __assert_fail("node != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFG.cpp"
                      ,0xf5,"enum CFG::Status CFG::check()");
      }
      bVar1 = CfgNode::hasPredecessor(this_00);
      if ((!bVar1) ||
         ((TVar2 = CfgNode::type(this_00), TVar2 != CFG_PHANTOM &&
          (bVar1 = CfgNode::hasSuccessors(this_00), !bVar1)))) goto LAB_001056f2;
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgNode_*>_>::operator++(&ed,0);
    }
    this->m_status = VALID;
  }
LAB_001056f2:
  return this->m_status;
}

Assistant:

enum CFG::Status CFG::check() {
	m_status = CFG::INVALID;

	if (!m_exitNode && !m_haltNode)
		goto out;

	if (m_entryNode->hasPredecessor() || !m_entryNode->hasSuccessors() ||
		(m_exitNode && (m_exitNode->hasSuccessors() || !m_exitNode->hasPredecessor())) ||
		(m_haltNode && (m_haltNode->hasSuccessors() || !m_haltNode->hasPredecessor())))
		goto out;

	for (std::map<Addr, CfgNode*>::iterator it = m_nodesMap.begin(),
			ed = m_nodesMap.end(); it != ed; it++) {
		CfgNode* node = it->second;
		assert(node != 0);

		if (!node->hasPredecessor() ||
			(node->type() != CfgNode::CFG_PHANTOM && !node->hasSuccessors()))
			goto out;
	}

	m_status = CFG::VALID;

out:
	return m_status;
}